

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O3

void icu_63::number::impl::blueprint_helpers::generateNumberingSystemOption
               (NumberingSystem *ns,UnicodeString *sb,UErrorCode *param_3)

{
  char *src;
  UnicodeString local_50;
  
  src = NumberingSystem::getName(ns);
  UnicodeString::UnicodeString(&local_50,src,-1,kInvariant);
  if (-1 < local_50.fUnion.fStackFields.fLengthAndFlags) {
    local_50.fUnion.fFields.fLength = (int)local_50.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  UnicodeString::doAppend(sb,&local_50,0,local_50.fUnion.fFields.fLength);
  UnicodeString::~UnicodeString(&local_50);
  return;
}

Assistant:

void blueprint_helpers::generateNumberingSystemOption(const NumberingSystem& ns, UnicodeString& sb,
                                                      UErrorCode&) {
    // Need to do char <-> UChar conversion...
    sb.append(UnicodeString(ns.getName(), -1, US_INV));
}